

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::StructColumnData::StructColumnData
          (StructColumnData *this,BlockManager *block_manager,DataTableInfo *info,idx_t column_index
          ,idx_t start_row,LogicalType *type_p,optional_ptr<duckdb::ColumnData,_true> parent)

{
  LogicalType *type;
  pointer ppVar1;
  bool bVar2;
  child_list_t<LogicalType> *pcVar3;
  InvalidInputException *this_00;
  pointer ppVar4;
  idx_t column_index_00;
  undefined1 local_68 [56];
  
  LogicalType::LogicalType((LogicalType *)(local_68 + 0x20),type_p);
  ColumnData::ColumnData
            (&this->super_ColumnData,block_manager,info,column_index,start_row,
             (LogicalType *)(local_68 + 0x20),parent);
  LogicalType::~LogicalType((LogicalType *)(local_68 + 0x20));
  (this->super_ColumnData)._vptr_ColumnData = (_func_int **)&PTR__StructColumnData_024899a8;
  (this->sub_columns).
  super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sub_columns).
  super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sub_columns).
  super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ValidityColumnData::ValidityColumnData
            (&this->validity,block_manager,info,0,start_row,&this->super_ColumnData);
  type = &(this->super_ColumnData).type;
  pcVar3 = StructType::GetChildTypes_abi_cxx11_(type);
  if (type->id_ != UNION) {
    bVar2 = StructType::IsUnnamed(type);
    if (bVar2) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_68._0_8_ = local_68 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"A table cannot be created from an unnamed struct","");
      InvalidInputException::InvalidInputException(this_00,(string *)local_68);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ppVar4 = (pcVar3->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (pcVar3->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    column_index_00 = 1;
    do {
      ColumnData::CreateColumnUnique
                ((ColumnData *)local_68,block_manager,info,column_index_00,start_row,&ppVar4->second
                 ,(optional_ptr<duckdb::ColumnData,_true>)this);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnData,std::default_delete<duckdb::ColumnData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnData,std::default_delete<duckdb::ColumnData>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnData,std::default_delete<duckdb::ColumnData>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ColumnData,std::default_delete<duckdb::ColumnData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnData,std::default_delete<duckdb::ColumnData>,true>>>
                  *)&this->sub_columns,
                 (unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *)
                 local_68);
      if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_68._0_8_ + 8))();
      }
      column_index_00 = column_index_00 + 1;
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar1);
  }
  return;
}

Assistant:

StructColumnData::StructColumnData(BlockManager &block_manager, DataTableInfo &info, idx_t column_index,
                                   idx_t start_row, LogicalType type_p, optional_ptr<ColumnData> parent)
    : ColumnData(block_manager, info, column_index, start_row, std::move(type_p), parent),
      validity(block_manager, info, 0, start_row, *this) {
	D_ASSERT(type.InternalType() == PhysicalType::STRUCT);
	auto &child_types = StructType::GetChildTypes(type);
	D_ASSERT(!child_types.empty());
	if (type.id() != LogicalTypeId::UNION && StructType::IsUnnamed(type)) {
		throw InvalidInputException("A table cannot be created from an unnamed struct");
	}
	// the sub column index, starting at 1 (0 is the validity mask)
	idx_t sub_column_index = 1;
	for (auto &child_type : child_types) {
		sub_columns.push_back(
		    ColumnData::CreateColumnUnique(block_manager, info, sub_column_index, start_row, child_type.second, this));
		sub_column_index++;
	}
}